

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3,false>
          (pdqsort_detail *this,
          __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
          begin,__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                end,anon_class_16_2_405d1b53 comp,int bad_allowed,bool leftmost)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  _Var7;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  _Var8;
  long lVar9;
  HighsLpRelaxation *pHVar10;
  undefined4 in_register_0000008c;
  HighsLpRelaxation *pHVar11;
  pair<int,_double> *b;
  pair<int,_double> *ppVar12;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  a;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  __first;
  double *pdVar13;
  ulong uVar14;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  a_00;
  pair<int,_double> *ppVar15;
  pair<int,_double> *ppVar16;
  anon_class_16_2_405d1b53 comp_00;
  anon_class_16_2_405d1b53 comp_01;
  anon_class_16_2_405d1b53 comp_02;
  anon_class_16_2_405d1b53 comp_03;
  anon_class_16_2_405d1b53 comp_04;
  anon_class_16_2_405d1b53 comp_05;
  anon_class_16_2_405d1b53 comp_06;
  anon_class_16_2_405d1b53 comp_07;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:752:13)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:752:13)>
  __comp_00;
  pair<int,_double> __value;
  pair<int,_double> __value_00;
  double *local_b0;
  uint local_a0;
  uint local_9c;
  pair<int,_double> local_98;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_80;
  anon_class_16_2_405d1b53 local_78;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_68;
  _DistanceType __len;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_58;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_50;
  long local_48;
  anon_class_16_2_405d1b53 comp_local;
  
  pHVar11 = (HighsLpRelaxation *)CONCAT44(in_register_0000008c,bad_allowed);
  comp_00.getFixVal = (HighsLpRelaxation *)comp.getFixVal;
  local_a0 = (uint)comp.heurlp;
  local_68._M_current = begin._M_current + -1;
  local_50._M_current = begin._M_current + -2;
  local_58._M_current = begin._M_current + -3;
  local_9c = bad_allowed;
  local_80._M_current = end._M_current;
  comp_local.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
  comp_local.heurlp = comp_00.getFixVal;
LAB_002dea31:
  do {
    lVar4 = (long)begin._M_current - (long)this;
    uVar6 = lVar4 >> 4;
    if ((long)uVar6 < 0x18) {
      local_78.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
      if ((local_9c & 1) == 0) {
        if ((pair<int,_double> *)this != begin._M_current) {
          ppVar12 = (pair<int,_double> *)((long)this + -0x10);
          local_78.heurlp = comp_00.getFixVal;
          while (ppVar16 = (pair<int,_double> *)((long)this + 0x10), ppVar16 != begin._M_current) {
            bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              (&local_78,ppVar16,(pair<int,_double> *)this);
            if (bVar3) {
              local_98.first = ppVar16->first;
              local_98._4_4_ = *(undefined4 *)&ppVar16->field_0x4;
              local_98.second = ((pair<int,_double> *)((long)this + 0x10))->second;
              ppVar15 = ppVar12;
              do {
                b = ppVar15;
                b[2].first = b[1].first;
                b[2].second = b[1].second;
                bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                  (&local_78,&local_98,b);
                ppVar15 = b + -1;
              } while (bVar3);
              b[1].first = local_98.first;
              b[1].second = local_98.second;
            }
            ppVar12 = ppVar12 + 1;
            this = (pdqsort_detail *)ppVar16;
          }
        }
      }
      else if ((pair<int,_double> *)this != begin._M_current) {
        lVar4 = 0;
        _Var7._M_current = (pair<int,_double> *)this;
        local_78.heurlp = comp_00.getFixVal;
        while (ppVar12 = _Var7._M_current + 1, ppVar12 != begin._M_current) {
          bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            (&local_78,ppVar12,_Var7._M_current);
          if (bVar3) {
            local_98.first = ppVar12->first;
            local_98._4_4_ = *(undefined4 *)&ppVar12->field_0x4;
            local_98.second = _Var7._M_current[1].second;
            lVar9 = lVar4;
            ppVar16 = ppVar12;
            do {
              ppVar15 = ppVar16;
              ppVar15->first = ppVar15[-1].first;
              ppVar15->second = ppVar15[-1].second;
              ppVar16 = (pair<int,_double> *)this;
              if (lVar9 == 0) break;
              ppVar16 = ppVar15 + -1;
              bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                (&local_78,&local_98,ppVar15 + -2);
              lVar9 = lVar9 + 0x10;
            } while (bVar3);
            ppVar16->first = local_98.first;
            ppVar15[-1].second = local_98.second;
          }
          lVar4 = lVar4 + -0x10;
          _Var7._M_current = ppVar12;
        }
      }
      return;
    }
    uVar14 = uVar6 >> 1;
    _Var7._M_current = (pair<int,_double> *)((long)this + uVar14 * 0x10);
    pHVar10 = comp_00.getFixVal;
    _Var8._M_current = (pair<int,_double> *)this;
    __len = uVar6;
    local_48 = lVar4;
    if (uVar6 < 0x81) {
      comp_07.heurlp = pHVar11;
      comp_07.getFixVal = (anon_class_32_4_ffb23deb *)comp_00.getFixVal;
      __first._M_current = (pair<int,_double> *)this;
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>
                ((pdqsort_detail *)_Var7._M_current,
                 (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                  )this,local_68,end,comp_07);
    }
    else {
      comp_03.heurlp = pHVar11;
      comp_03.getFixVal = (anon_class_32_4_ffb23deb *)comp_00.getFixVal;
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>
                (this,_Var7,local_68,end,comp_03);
      a._M_current = _Var8._M_current + (uVar14 - 1);
      comp_04.heurlp = pHVar11;
      comp_04.getFixVal = (anon_class_32_4_ffb23deb *)comp_00.getFixVal;
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>
                ((pdqsort_detail *)((long)this + 0x10),a,local_50,local_80,comp_04);
      a_00._M_current = _Var8._M_current + uVar14 + 1;
      comp_05.heurlp = pHVar11;
      comp_05.getFixVal = (anon_class_32_4_ffb23deb *)comp_00.getFixVal;
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>
                ((pdqsort_detail *)(_Var8._M_current + 2),a_00,local_58,local_80,comp_05);
      end._M_current = local_80._M_current;
      comp_06.heurlp = pHVar11;
      comp_06.getFixVal = (anon_class_32_4_ffb23deb *)comp_00.getFixVal;
      __first._M_current = _Var8._M_current;
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>
                ((pdqsort_detail *)a._M_current,_Var7,a_00,local_80,comp_06);
      iVar2 = (_Var8._M_current)->first;
      (_Var8._M_current)->first = (_Var7._M_current)->first;
      (_Var7._M_current)->first = iVar2;
      dVar1 = (_Var8._M_current)->second;
      (_Var8._M_current)->second = (_Var7._M_current)->second;
      (_Var7._M_current)->second = dVar1;
    }
    if (((local_9c & 1) == 0) &&
       (bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          (&comp_local,_Var8._M_current + -1,_Var8._M_current), !bVar3)) {
      local_98.first = (_Var8._M_current)->first;
      local_98._4_4_ = *(undefined4 *)&(_Var8._M_current)->field_0x4;
      local_98.second = (_Var8._M_current)->second;
      lVar4 = -0x10;
      _Var7._M_current = begin._M_current;
      local_78.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
      local_78.heurlp = comp_00.getFixVal;
      do {
        _Var7._M_current = _Var7._M_current + -1;
        bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          (&local_78,&local_98,_Var7._M_current);
        lVar4 = lVar4 + 0x10;
      } while (bVar3);
      ppVar12 = __first._M_current;
      if (lVar4 == 0) {
        do {
          if (_Var7._M_current <= __first._M_current) break;
          __first._M_current = __first._M_current + 1;
          bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            (&local_78,&local_98,__first._M_current);
        } while (!bVar3);
      }
      else {
        do {
          __first._M_current = _Var8._M_current + 1;
          bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            (&local_78,&local_98,__first._M_current);
          _Var8._M_current = __first._M_current;
        } while (!bVar3);
      }
      while (__first._M_current < _Var7._M_current) {
        iVar2 = (__first._M_current)->first;
        (__first._M_current)->first = (_Var7._M_current)->first;
        (_Var7._M_current)->first = iVar2;
        dVar1 = (__first._M_current)->second;
        (__first._M_current)->second = (_Var7._M_current)->second;
        (_Var7._M_current)->second = dVar1;
        do {
          _Var7._M_current = _Var7._M_current + -1;
          bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            (&local_78,&local_98,_Var7._M_current);
        } while (bVar3);
        do {
          __first._M_current = __first._M_current + 1;
          bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            (&local_78,&local_98,__first._M_current);
        } while (!bVar3);
      }
      ppVar12->first = (_Var7._M_current)->first;
      ppVar12->second = (_Var7._M_current)->second;
      (_Var7._M_current)->first = local_98.first;
      (_Var7._M_current)->second = local_98.second;
      this = (pdqsort_detail *)(_Var7._M_current + 1);
      goto LAB_002dea31;
    }
    local_98.first = (_Var8._M_current)->first;
    local_98._4_4_ = *(undefined4 *)&(_Var8._M_current)->field_0x4;
    local_98.second = (_Var8._M_current)->second;
    lVar4 = 0x10;
    local_78.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
    local_78.heurlp = comp_00.getFixVal;
    do {
      _Var8._M_current = _Var8._M_current + 1;
      bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                        (&local_78,_Var8._M_current,&local_98);
      lVar4 = lVar4 + -0x10;
    } while (bVar3);
    _Var7._M_current = begin._M_current;
    this = (pdqsort_detail *)_Var8._M_current;
    if (lVar4 == 0) {
      do {
        ppVar12 = _Var7._M_current;
        if (_Var7._M_current <= _Var8._M_current) break;
        _Var7._M_current = _Var7._M_current + -1;
        bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          (&local_78,_Var7._M_current,&local_98);
        ppVar12 = _Var7._M_current;
      } while (!bVar3);
    }
    else {
      do {
        _Var7._M_current = _Var7._M_current + -1;
        bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          (&local_78,_Var7._M_current,&local_98);
        ppVar12 = _Var7._M_current;
      } while (!bVar3);
    }
    while (end._M_current = local_80._M_current, this < _Var7._M_current) {
      iVar2 = ((pair<int,_double> *)this)->first;
      ((pair<int,_double> *)this)->first = (_Var7._M_current)->first;
      (_Var7._M_current)->first = iVar2;
      dVar1 = ((pair<int,_double> *)this)->second;
      ((pair<int,_double> *)this)->second = (_Var7._M_current)->second;
      (_Var7._M_current)->second = dVar1;
      do {
        this = (pdqsort_detail *)((long)this + 0x10);
        bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          (&local_78,(pair<int,_double> *)this,&local_98);
      } while (bVar3);
      do {
        _Var7._M_current = _Var7._M_current + -1;
        bVar3 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          (&local_78,_Var7._M_current,&local_98);
      } while (!bVar3);
    }
    _Var7._M_current = (pair<int,_double> *)((long)this + -0x10);
    (__first._M_current)->first = ((pair<int,_double> *)((long)this + -0x10))->first;
    (__first._M_current)->second = ((pair<int,_double> *)((long)this + -0x10))->second;
    ((pair<int,_double> *)((long)this + -0x10))->first = local_98.first;
    ((pair<int,_double> *)((long)this + -0x10))->second = local_98.second;
    uVar14 = (long)_Var7._M_current - (long)__first._M_current >> 4;
    uVar6 = (long)begin._M_current - (long)this >> 4;
    if (((long)uVar14 < (long)((ulong)__len >> 3)) || ((long)uVar6 < (long)((ulong)__len >> 3))) {
      pHVar10 = (HighsLpRelaxation *)(ulong)(local_a0 - 1);
      if (local_a0 - 1 == 0) {
        uVar6 = __len - 2U >> 1;
        pdVar13 = &__first._M_current[uVar6].second;
        _Var7._M_current = __first._M_current;
        do {
          __value._4_4_ = 0;
          __value.first = ((pair<int,_double> *)(pdVar13 + -1))->first;
          __comp._M_comp.heurlp = comp_00.getFixVal;
          __comp._M_comp.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
          __value.second = *pdVar13;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,std::pair<int,double>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>>
                    (__first,uVar6,__len,__value,__comp);
          pdVar13 = pdVar13 + -2;
          bVar3 = uVar6 != 0;
          uVar6 = uVar6 - 1;
        } while (bVar3);
        local_b0 = &begin._M_current[-1].second;
        lVar4 = local_48;
        while (0x10 < lVar4) {
          __value_00._4_4_ = 0;
          __value_00.first = ((pair<int,_double> *)(local_b0 + -1))->first;
          dVar1 = *local_b0;
          ((pair<int,_double> *)(local_b0 + -1))->first = (_Var7._M_current)->first;
          *local_b0 = (_Var7._M_current)->second;
          lVar4 = lVar4 + -0x10;
          __comp_00._M_comp.heurlp = comp_00.getFixVal;
          __comp_00._M_comp.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
          __value_00.second = dVar1;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,std::pair<int,double>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>>
                    (_Var7,0,lVar4 >> 4,__value_00,__comp_00);
          local_b0 = local_b0 + -2;
        }
        return;
      }
      if (0x17 < (long)uVar14) {
        uVar5 = uVar14 >> 2;
        iVar2 = (__first._M_current)->first;
        (__first._M_current)->first = __first._M_current[uVar5].first;
        __first._M_current[uVar5].first = iVar2;
        dVar1 = (__first._M_current)->second;
        (__first._M_current)->second = __first._M_current[uVar5].second;
        __first._M_current[uVar5].second = dVar1;
        ppVar12 = _Var7._M_current + -uVar5;
        iVar2 = ((pair<int,_double> *)((long)this + -0x20))->first;
        ((pair<int,_double> *)((long)this + -0x20))->first = ppVar12->first;
        ppVar12->first = iVar2;
        dVar1 = ((pair<int,_double> *)((long)this + -0x20))->second;
        ((pair<int,_double> *)((long)this + -0x20))->second = ppVar12->second;
        ppVar12->second = dVar1;
        if (0x80 < uVar14) {
          iVar2 = __first._M_current[1].first;
          __first._M_current[1].first = __first._M_current[uVar5 + 1].first;
          __first._M_current[uVar5 + 1].first = iVar2;
          dVar1 = __first._M_current[1].second;
          __first._M_current[1].second = __first._M_current[uVar5 + 1].second;
          __first._M_current[uVar5 + 1].second = dVar1;
          iVar2 = __first._M_current[2].first;
          __first._M_current[2].first = __first._M_current[uVar5 + 2].first;
          __first._M_current[uVar5 + 2].first = iVar2;
          dVar1 = __first._M_current[2].second;
          __first._M_current[2].second = __first._M_current[uVar5 + 2].second;
          __first._M_current[uVar5 + 2].second = dVar1;
          lVar4 = -uVar5;
          uVar5 = ~uVar5;
          iVar2 = ((pair<int,_double> *)((long)this + -0x30))->first;
          ((pair<int,_double> *)((long)this + -0x30))->first = _Var7._M_current[uVar5].first;
          _Var7._M_current[uVar5].first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + -0x30))->second;
          ((pair<int,_double> *)((long)this + -0x30))->second =
               ((pair<int,_double> *)((long)this + (uVar5 - 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar5 - 1) * 0x10))->second = dVar1;
          iVar2 = ((pair<int,_double> *)((long)this + -0x40))->first;
          ((pair<int,_double> *)((long)this + -0x40))->first = _Var7._M_current[lVar4 + -2].first;
          _Var7._M_current[lVar4 + -2].first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + -0x40))->second;
          ((pair<int,_double> *)((long)this + -0x40))->second =
               ((pair<int,_double> *)((long)this + (lVar4 + -3) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (lVar4 + -3) * 0x10))->second = dVar1;
        }
      }
      if (0x17 < (long)uVar6) {
        uVar14 = uVar6 >> 2;
        iVar2 = ((pair<int,_double> *)this)->first;
        ((pair<int,_double> *)this)->first =
             ((pair<int,_double> *)((long)this + uVar14 * 0x10))->first;
        ((pair<int,_double> *)((long)this + uVar14 * 0x10))->first = iVar2;
        dVar1 = ((pair<int,_double> *)this)->second;
        ((pair<int,_double> *)this)->second =
             ((pair<int,_double> *)((long)this + uVar14 * 0x10))->second;
        ((pair<int,_double> *)((long)this + uVar14 * 0x10))->second = dVar1;
        ppVar12 = begin._M_current + -uVar14;
        iVar2 = begin._M_current[-1].first;
        begin._M_current[-1].first = ppVar12->first;
        ppVar12->first = iVar2;
        dVar1 = begin._M_current[-1].second;
        begin._M_current[-1].second = ppVar12->second;
        ppVar12->second = dVar1;
        if (0x80 < uVar6) {
          iVar2 = ((pair<int,_double> *)((long)this + 0x10))->first;
          ((pair<int,_double> *)((long)this + 0x10))->first =
               ((pair<int,_double> *)((long)this + (uVar14 + 1) * 0x10))->first;
          ((pair<int,_double> *)((long)this + (uVar14 + 1) * 0x10))->first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + 0x10))->second;
          ((pair<int,_double> *)((long)this + 0x10))->second =
               ((pair<int,_double> *)((long)this + (uVar14 + 1) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar14 + 1) * 0x10))->second = dVar1;
          iVar2 = ((pair<int,_double> *)((long)this + 0x20))->first;
          ((pair<int,_double> *)((long)this + 0x20))->first =
               ((pair<int,_double> *)((long)this + (uVar14 + 2) * 0x10))->first;
          ((pair<int,_double> *)((long)this + (uVar14 + 2) * 0x10))->first = iVar2;
          dVar1 = ((pair<int,_double> *)((long)this + 0x20))->second;
          ((pair<int,_double> *)((long)this + 0x20))->second =
               ((pair<int,_double> *)((long)this + (uVar14 + 2) * 0x10))->second;
          ((pair<int,_double> *)((long)this + (uVar14 + 2) * 0x10))->second = dVar1;
          lVar4 = -2 - uVar14;
          uVar14 = ~uVar14;
          iVar2 = begin._M_current[-2].first;
          begin._M_current[-2].first = begin._M_current[uVar14].first;
          begin._M_current[uVar14].first = iVar2;
          dVar1 = begin._M_current[-2].second;
          begin._M_current[-2].second = begin._M_current[uVar14].second;
          begin._M_current[uVar14].second = dVar1;
          iVar2 = begin._M_current[-3].first;
          begin._M_current[-3].first = begin._M_current[lVar4].first;
          begin._M_current[lVar4].first = iVar2;
          dVar1 = begin._M_current[-3].second;
          begin._M_current[-3].second = begin._M_current[lVar4].second;
          begin._M_current[lVar4].second = dVar1;
        }
      }
    }
    else if (_Var8._M_current < ppVar12) {
      pHVar10 = (HighsLpRelaxation *)(ulong)local_a0;
    }
    else {
      comp_00.heurlp = pHVar10;
      bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>
                        ((pdqsort_detail *)__first._M_current,_Var7,local_80,comp_00);
      if (bVar3) {
        comp_01.heurlp = pHVar10;
        comp_01.getFixVal = (anon_class_32_4_ffb23deb *)comp_00.getFixVal;
        bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>
                          (this,begin,end,comp_01);
        pHVar10 = (HighsLpRelaxation *)(ulong)local_a0;
        if (bVar3) {
          return;
        }
      }
      else {
        pHVar10 = (HighsLpRelaxation *)(ulong)local_a0;
      }
    }
    pHVar11 = (HighsLpRelaxation *)(ulong)(local_9c & 1);
    local_a0 = (uint)pHVar10;
    comp_02.heurlp = pHVar10;
    comp_02.getFixVal = (anon_class_32_4_ffb23deb *)comp_00.getFixVal;
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3,false>
              ((pdqsort_detail *)__first._M_current,_Var7,end,comp_02,local_9c & 1,
               SUB81(__first._M_current,0));
    local_9c = 0;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }